

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator
          (RuleBasedCollator *this,uint8_t *bin,int32_t length,RuleBasedCollator *base,
          UErrorCode *errorCode)

{
  UBool UVar1;
  CollationTailoring *pCVar2;
  char *size;
  CollationTailoring *local_90;
  LocalPointerBase<icu_63::CollationTailoring> local_50;
  LocalPointer<icu_63::CollationTailoring> t;
  CollationTailoring *root;
  UErrorCode *errorCode_local;
  RuleBasedCollator *base_local;
  int32_t length_local;
  uint8_t *bin_local;
  RuleBasedCollator *this_local;
  
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_004df0c0;
  this->data = (CollationData *)0x0;
  this->settings = (CollationSettings *)0x0;
  this->tailoring = (CollationTailoring *)0x0;
  this->cacheEntry = (CollationCacheEntry *)0x0;
  size = "";
  Locale::Locale(&this->validLocale,"",(char *)0x0,(char *)0x0,(char *)0x0);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return;
  }
  if (((bin == (uint8_t *)0x0) || (length == 0)) || (base == (RuleBasedCollator *)0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr =
       (LocalPointerBase<icu_63::CollationTailoring>)CollationRoot::getRoot(errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return;
  }
  if ((LocalPointerBase<icu_63::CollationTailoring>)base->tailoring !=
      t.super_LocalPointerBase<icu_63::CollationTailoring>.ptr) {
    *errorCode = U_UNSUPPORTED_ERROR;
    return;
  }
  pCVar2 = (CollationTailoring *)UMemory::operator_new((UMemory *)0x190,(size_t)size);
  local_90 = (CollationTailoring *)0x0;
  if (pCVar2 != (CollationTailoring *)0x0) {
    CollationTailoring::CollationTailoring(pCVar2,base->tailoring->settings);
    local_90 = pCVar2;
  }
  LocalPointer<icu_63::CollationTailoring>::LocalPointer
            ((LocalPointer<icu_63::CollationTailoring> *)&local_50,local_90);
  UVar1 = LocalPointerBase<icu_63::CollationTailoring>::isNull(&local_50);
  if (UVar1 == '\0') {
    pCVar2 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_50);
    UVar1 = CollationTailoring::isBogus(pCVar2);
    if (UVar1 == '\0') {
      pCVar2 = base->tailoring;
      LocalPointerBase<icu_63::CollationTailoring>::operator*(&local_50);
      CollationDataReader::read((int)pCVar2,bin,(ulong)(uint)length);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        pCVar2 = LocalPointerBase<icu_63::CollationTailoring>::operator->(&local_50);
        Locale::setToBogus(&pCVar2->actualLocale);
        pCVar2 = LocalPointerBase<icu_63::CollationTailoring>::orphan(&local_50);
        adoptTailoring(this,pCVar2,errorCode);
      }
      goto LAB_0027239c;
    }
  }
  *errorCode = U_MEMORY_ALLOCATION_ERROR;
LAB_0027239c:
  LocalPointer<icu_63::CollationTailoring>::~LocalPointer
            ((LocalPointer<icu_63::CollationTailoring> *)&local_50);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const uint8_t *bin, int32_t length,
                                     const RuleBasedCollator *base, UErrorCode &errorCode)
        : data(NULL),
          settings(NULL),
          tailoring(NULL),
          cacheEntry(NULL),
          validLocale(""),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
    if(U_FAILURE(errorCode)) { return; }
    if(bin == NULL || length == 0 || base == NULL) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    const CollationTailoring *root = CollationRoot::getRoot(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(base->tailoring != root) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    LocalPointer<CollationTailoring> t(new CollationTailoring(base->tailoring->settings));
    if(t.isNull() || t->isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    CollationDataReader::read(base->tailoring, bin, length, *t, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    t->actualLocale.setToBogus();
    adoptTailoring(t.orphan(), errorCode);
}